

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::BeginAssertionInst::Exec
          (BeginAssertionInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  int toGroupId;
  CharCount CVar1;
  PageAllocation *pPVar2;
  size_t sVar3;
  uint8 *puVar4;
  Program *pPVar5;
  uint8 *puVar6;
  size_t sVar7;
  code *pcVar8;
  bool bVar9;
  undefined4 *puVar10;
  
  if ((BeginAssertionInst *)*instPointer != this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x1123,"(instPointer == (uint8*)this)","instPointer == (uint8*)this");
    if (!bVar9) goto LAB_00f0f3f7;
    *puVar10 = 0;
  }
  if (((this->super_NegationMixin).isNegation == false) &&
     (toGroupId = (this->super_BodyGroupsMixin).maxBodyGroupId, -1 < toGroupId)) {
    Matcher::DoSaveInnerGroups
              (matcher,(this->super_BodyGroupsMixin).minBodyGroupId,toGroupId,false,input,contStack)
    ;
  }
  if ((assertionStack->super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>).
      super_ContinuousPageStack<1UL>.bufferSize -
      (assertionStack->super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>).
      super_ContinuousPageStack<1UL>.nextTop < 0x10) {
    ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)assertionStack,0x10);
  }
  if ((assertionStack->super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>).
      super_ContinuousPageStack<1UL>.bufferSize == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                       ,199,"(bufferSize)","bufferSize");
    if (!bVar9) goto LAB_00f0f3f7;
    *puVar10 = 0;
  }
  pPVar2 = (assertionStack->
           super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>).
           super_ContinuousPageStack<1UL>.pageAllocation;
  sVar3 = (assertionStack->
          super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>).
          super_ContinuousPageStack<1UL>.nextTop;
  (assertionStack->super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>).
  super_ContinuousPageStack<1UL>.nextTop = sVar3 + 0x10;
  puVar4 = *instPointer;
  pPVar5 = (matcher->program).ptr;
  puVar6 = *(uint8 **)&pPVar5->rep;
  if ((puVar4 < puVar6) || (puVar6 + (pPVar5->rep).insts.instsLen <= puVar4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x767,
                       "(inst >= program->rep.insts.insts && inst < program->rep.insts.insts + program->rep.insts.instsLen)"
                       ,
                       "inst >= program->rep.insts.insts && inst < program->rep.insts.insts + program->rep.insts.instsLen"
                      );
    if (!bVar9) goto LAB_00f0f3f7;
    *puVar10 = 0;
  }
  CVar1 = *inputOffset;
  sVar7 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
          super_ContinuousPageStack<1UL>.nextTop;
  *(Type *)((long)&pPVar2[1].pageCount + sVar3) =
       (int)puVar4 - (((matcher->program).ptr)->rep).boiLiteral2.literal;
  *(CharCount *)((long)&pPVar2[1].pageCount + sVar3 + 4) = CVar1;
  *(size_t *)((long)&pPVar2[1].segment + sVar3) = sVar7;
  if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
      super_ContinuousPageStack<1UL>.bufferSize - sVar7 < 0x18) {
    ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x18);
  }
  if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
      super_ContinuousPageStack<1UL>.bufferSize == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                       ,199,"(bufferSize)","bufferSize");
    if (!bVar9) {
LAB_00f0f3f7:
      pcVar8 = (code *)invalidInstructionException();
      (*pcVar8)();
    }
    *puVar10 = 0;
  }
  pPVar2 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
           super_ContinuousPageStack<1UL>.pageAllocation;
  sVar3 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
          super_ContinuousPageStack<1UL>.nextTop;
  (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
  super_ContinuousPageStack<1UL>.nextTop = sVar3 + 0x18;
  *(size_t *)((long)&pPVar2[1].pageCount + sVar3) =
       (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
       topElementSize;
  (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).topElementSize =
       0x18;
  *(undefined1 *)((long)&pPVar2[2].pageCount + sVar3) = 6;
  *(undefined ***)((long)&pPVar2[1].segment + sVar3) = &PTR_Print_01559878;
  Matcher::PushStats(matcher,contStack,input);
  *instPointer = *instPointer + 0xe;
  return false;
}

Assistant:

inline bool BeginAssertionInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        Assert(instPointer == (uint8*)this);

        if (!isNegation)
        {
            // If the positive assertion binds some groups then on success any RestoreGroup continuations pushed
            // in the assertion body will be cut. Hence if the entire assertion is backtracked over we must restore
            // the current inner group bindings.
            matcher.SaveInnerGroups(minBodyGroupId, maxBodyGroupId, false, input, contStack);
        }

        PUSHA(assertionStack, AssertionInfo, matcher.InstPointerToLabel(instPointer), inputOffset, contStack.Position());
        PUSH(contStack, PopAssertionCont);
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.PushStats(contStack, input);
#endif

        instPointer += sizeof(*this);
        return false;
    }